

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall Assimp::IFC::Schema_2x3::IfcInventory::IfcInventory(IfcInventory *this)

{
  *(undefined ***)&this->field_0x160 = &PTR__Object_00836880;
  *(undefined8 *)&this->field_0x168 = 0;
  *(char **)&this->field_0x170 = "IfcInventory";
  IfcGroup::IfcGroup((IfcGroup *)this,&PTR_construction_vtable_24__008dadf8);
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcInventory,_6UL>).aux_is_derived.
  super__Base_bitset<1UL>._M_w = 0;
  *(undefined8 *)this = 0x8dad18;
  *(undefined8 *)&this->field_0x160 = 0x8dade0;
  *(undefined8 *)&this->field_0x88 = 0x8dad40;
  *(undefined8 *)&this->field_0x98 = 0x8dad68;
  *(undefined8 *)&this->field_0xd0 = 0x8dad90;
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcInventory,_6UL>)._vptr_ObjectHelper =
       (_func_int **)0x8dadb8;
  *(undefined1 **)&(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcInventory,_6UL>).field_0x10
       = &(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcInventory,_6UL>).field_0x20;
  *(undefined8 *)&(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcInventory,_6UL>).field_0x18
       = 0;
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcInventory,_6UL>).field_0x20 = 0;
  (this->OriginalValue).ptr.obj = (LazyObject *)0x0;
  (this->OriginalValue).have = false;
  (this->Jurisdiction).
  super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->Jurisdiction).
  super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->ResponsiblePersons).
  super_vector<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::NotImplemented>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::NotImplemented>_>_>
  .
  super__Vector_base<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::NotImplemented>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::NotImplemented>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->ResponsiblePersons).
  super_vector<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::NotImplemented>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::NotImplemented>_>_>
  .
  super__Vector_base<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::NotImplemented>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::NotImplemented>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->ResponsiblePersons).
  super_vector<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::NotImplemented>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::NotImplemented>_>_>
  .
  super__Vector_base<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::NotImplemented>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::NotImplemented>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->LastUpdateDate).obj = (LazyObject *)0x0;
  *(undefined8 *)((long)&(this->LastUpdateDate).obj + 1) = 0;
  *(undefined8 *)((long)&(this->CurrentValue).ptr.obj + 1) = 0;
  return;
}

Assistant:

IfcInventory() : Object("IfcInventory") {}